

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int fftsad(fitsfile *mfptr,HDUtracker *HDU,int *newPosition,char *newFileName)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  char *__dest_00;
  uint uVar4;
  ulong uVar5;
  int status;
  int hdunum;
  char filename2 [1025];
  char filename1 [1025];
  int local_858;
  int local_854;
  int *local_850;
  char local_848 [1040];
  char local_438 [1032];
  
  local_858 = 0;
  ffghdn(mfptr,&local_854);
  local_858 = ffflnm(mfptr,local_438,&local_858);
  local_858 = ffrtnm(local_438,local_848,&local_858);
  iVar2 = local_854;
  uVar1 = HDU->nHDU;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    local_850 = newPosition;
    do {
      if (HDU->position[uVar5] == iVar2) {
        iVar3 = strcmp(HDU->filename[uVar5],local_848);
        if (iVar3 == 0) goto LAB_00181ddf;
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar5 = (ulong)uVar1;
LAB_00181ddf:
    uVar4 = (uint)uVar5;
    newPosition = local_850;
  }
  if (uVar4 == uVar1) {
    if (uVar1 == 1000) {
      local_858 = 0x159;
    }
    else {
      __dest = (char *)malloc(0x401);
      HDU->filename[uVar4] = __dest;
      if (__dest == (char *)0x0) {
        local_858 = 0x71;
      }
      else {
        __dest_00 = (char *)malloc(0x401);
        HDU->newFilename[uVar4] = __dest_00;
        if (__dest_00 == (char *)0x0) {
          local_858 = 0x71;
          free(__dest);
        }
        else {
          HDU->position[uVar4] = local_854;
          HDU->newPosition[uVar4] = local_854;
          strcpy(__dest,local_848);
          strcpy(__dest_00,local_848);
          HDU->nHDU = uVar1 + 1;
        }
      }
    }
  }
  else {
    local_858 = 0x15a;
    if (newPosition != (int *)0x0) {
      *newPosition = HDU->newPosition[uVar4];
    }
    if (newFileName != (char *)0x0) {
      strcpy(newFileName,HDU->newFilename[uVar4]);
    }
  }
  return local_858;
}

Assistant:

int fftsad(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int        *newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  add an HDU to the HDUtracker struct pointed to by HDU. The HDU is only 
  added if it does not already reside in the HDUtracker. If it already
  resides in the HDUtracker then the new HDU postion and file name are
  returned in  newPosition and newFileName (if != NULL)
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];

  do
    {
      /* retrieve the HDU's position within the FITS file */

      fits_get_hdu_num(mfptr,&hdunum);
      
      /* retrieve the HDU's file name */
      
      status = fits_file_name(mfptr,filename1,&status);
      
      /* parse the file name and construct the "standard" URL for it */
      
      status = ffrtnm(filename1,filename2,&status);
      
      /* 
	 examine all the existing HDUs in the HDUtracker an see if this HDU
	 has already been registered
      */

      for(i = 0; 
       i < HDU->nHDU &&  !(HDU->position[i] == hdunum 
			   && strcmp(HDU->filename[i],filename2) == 0);
	  ++i);

      if(i != HDU->nHDU) 
	{
	  status = HDU_ALREADY_TRACKED;
	  if(newPosition != NULL) *newPosition = HDU->newPosition[i];
	  if(newFileName != NULL) strcpy(newFileName,HDU->newFilename[i]);
	  continue;
	}

      if(HDU->nHDU == MAX_HDU_TRACKER) 
	{
	  status = TOO_MANY_HDUS_TRACKED;
	  continue;
	}

      HDU->filename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->filename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  continue;
	}

      HDU->newFilename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->newFilename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  free(HDU->filename[i]);
	  continue;
	}

      HDU->position[i]    = hdunum;
      HDU->newPosition[i] = hdunum;

      strcpy(HDU->filename[i],filename2);
      strcpy(HDU->newFilename[i],filename2);
 
       ++(HDU->nHDU);

    }while(0);

  return(status);
}